

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  AABBNodeMB4D *node1;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong *puVar23;
  ulong uVar24;
  Scene *pSVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  float fVar36;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar60;
  float fVar62;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar65;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  float fVar63;
  float fVar64;
  float fVar66;
  undefined1 auVar59 [16];
  float fVar67;
  float fVar83;
  float fVar84;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar85;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  float fVar117;
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar127;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar125;
  float fVar126;
  undefined1 auVar124 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  float fVar134;
  undefined1 auVar135 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [64];
  float fVar140;
  undefined1 auVar141 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar142 [64];
  float fVar146;
  undefined1 auVar147 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar148 [64];
  float fVar152;
  undefined1 auVar153 [16];
  float fVar158;
  undefined1 auVar154 [16];
  float fVar156;
  float fVar157;
  undefined1 auVar155 [64];
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_aa9;
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  int local_a8c;
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  RayQueryContext *local_a60;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  long local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  uint local_9b0;
  uint local_9ac;
  uint local_9a8;
  RTCFilterFunctionNArguments local_998;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_a60 = context;
      puVar23 = local_7d8 + 1;
      auVar29 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar40 = vandps_avx((undefined1  [16])aVar5,auVar40);
      auVar82._8_4_ = 0x219392ef;
      auVar82._0_8_ = 0x219392ef219392ef;
      auVar82._12_4_ = 0x219392ef;
      auVar40 = vcmpps_avx(auVar40,auVar82,1);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar82 = vdivps_avx(auVar100,(undefined1  [16])aVar5);
      auVar101._8_4_ = 0x5d5e0b6b;
      auVar101._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar101._12_4_ = 0x5d5e0b6b;
      auVar40 = vblendvps_avx(auVar82,auVar101,auVar40);
      auVar88._0_4_ = auVar40._0_4_ * 0.99999964;
      auVar88._4_4_ = auVar40._4_4_ * 0.99999964;
      auVar88._8_4_ = auVar40._8_4_ * 0.99999964;
      auVar88._12_4_ = auVar40._12_4_ * 0.99999964;
      auVar68._0_4_ = auVar40._0_4_ * 1.0000004;
      auVar68._4_4_ = auVar40._4_4_ * 1.0000004;
      auVar68._8_4_ = auVar40._8_4_ * 1.0000004;
      auVar68._12_4_ = auVar40._12_4_ * 1.0000004;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_8b8._4_4_ = uVar4;
      local_8b8._0_4_ = uVar4;
      local_8b8._8_4_ = uVar4;
      local_8b8._12_4_ = uVar4;
      auVar116 = ZEXT1664(local_8b8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_8c8._4_4_ = uVar4;
      local_8c8._0_4_ = uVar4;
      local_8c8._8_4_ = uVar4;
      local_8c8._12_4_ = uVar4;
      auVar124 = ZEXT1664(local_8c8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_8d8._4_4_ = uVar4;
      local_8d8._0_4_ = uVar4;
      local_8d8._8_4_ = uVar4;
      local_8d8._12_4_ = uVar4;
      auVar131 = ZEXT1664(local_8d8);
      local_8e8 = vshufps_avx(auVar88,auVar88,0);
      auVar133 = ZEXT1664(local_8e8);
      auVar40 = vmovshdup_avx(auVar88);
      local_8f8 = vshufps_avx(auVar88,auVar88,0x55);
      auVar136 = ZEXT1664(local_8f8);
      auVar82 = vshufpd_avx(auVar88,auVar88,1);
      local_908 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar142 = ZEXT1664(local_908);
      local_918 = vshufps_avx(auVar68,auVar68,0);
      auVar148 = ZEXT1664(local_918);
      uVar24 = (ulong)(auVar88._0_4_ < 0.0) << 4;
      local_928 = vshufps_avx(auVar68,auVar68,0x55);
      auVar106 = ZEXT1664(local_928);
      local_938 = vshufps_avx(auVar68,auVar68,0xaa);
      auVar155 = ZEXT1664(local_938);
      uVar26 = (ulong)(auVar40._0_4_ < 0.0) << 4 | 0x20;
      uVar21 = (ulong)(auVar82._0_4_ < 0.0) << 4 | 0x40;
      uVar27 = uVar24 ^ 0x10;
      local_948 = vshufps_avx(auVar29,auVar29,0);
      auVar110 = ZEXT1664(local_948);
      local_958 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar160 = ZEXT1664(local_958);
      local_968 = mm_lookupmask_ps._240_8_;
      uStack_960 = mm_lookupmask_ps._248_8_;
LAB_00b6f049:
      if (puVar23 != local_7d8) {
        uVar28 = puVar23[-1];
        puVar23 = puVar23 + -1;
        do {
          fVar3 = (ray->dir).field_0.m128[3];
          auVar29._4_4_ = fVar3;
          auVar29._0_4_ = fVar3;
          auVar29._8_4_ = fVar3;
          auVar29._12_4_ = fVar3;
          do {
            if ((uVar28 & 8) != 0) {
              lVar22 = (ulong)((uint)uVar28 & 0xf) - 8;
              uVar28 = uVar28 & 0xfffffffffffffff0;
              local_9d0 = 0;
              goto LAB_00b6f1dc;
            }
            uVar17 = uVar28 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar17 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar17 + 0x20 + uVar24);
            auVar38._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar38._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar38._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar38._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar40 = vsubps_avx(auVar38,auVar116._0_16_);
            auVar39._0_4_ = auVar133._0_4_ * auVar40._0_4_;
            auVar39._4_4_ = auVar133._4_4_ * auVar40._4_4_;
            auVar39._8_4_ = auVar133._8_4_ * auVar40._8_4_;
            auVar39._12_4_ = auVar133._12_4_ * auVar40._12_4_;
            pfVar2 = (float *)(uVar17 + 0x80 + uVar26);
            auVar40 = vmaxps_avx(auVar110._0_16_,auVar39);
            pfVar1 = (float *)(uVar17 + 0x20 + uVar26);
            auVar51._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar51._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar51._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar51._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar82 = vsubps_avx(auVar51,auVar124._0_16_);
            pfVar2 = (float *)(uVar17 + 0x80 + uVar21);
            pfVar1 = (float *)(uVar17 + 0x20 + uVar21);
            auVar69._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar69._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar69._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar69._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar52._0_4_ = auVar136._0_4_ * auVar82._0_4_;
            auVar52._4_4_ = auVar136._4_4_ * auVar82._4_4_;
            auVar52._8_4_ = auVar136._8_4_ * auVar82._8_4_;
            auVar52._12_4_ = auVar136._12_4_ * auVar82._12_4_;
            auVar82 = vsubps_avx(auVar69,auVar131._0_16_);
            auVar70._0_4_ = auVar142._0_4_ * auVar82._0_4_;
            auVar70._4_4_ = auVar142._4_4_ * auVar82._4_4_;
            auVar70._8_4_ = auVar142._8_4_ * auVar82._8_4_;
            auVar70._12_4_ = auVar142._12_4_ * auVar82._12_4_;
            auVar82 = vmaxps_avx(auVar52,auVar70);
            pfVar2 = (float *)(uVar17 + 0x80 + uVar27);
            pfVar1 = (float *)(uVar17 + 0x20 + uVar27);
            auVar71._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar71._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar71._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar71._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar40 = vmaxps_avx(auVar40,auVar82);
            auVar82 = vsubps_avx(auVar71,auVar116._0_16_);
            auVar53._0_4_ = auVar148._0_4_ * auVar82._0_4_;
            auVar53._4_4_ = auVar148._4_4_ * auVar82._4_4_;
            auVar53._8_4_ = auVar148._8_4_ * auVar82._8_4_;
            auVar53._12_4_ = auVar148._12_4_ * auVar82._12_4_;
            auVar82 = vminps_avx(auVar160._0_16_,auVar53);
            pfVar2 = (float *)(uVar17 + 0x80 + (uVar26 ^ 0x10));
            pfVar1 = (float *)(uVar17 + 0x20 + (uVar26 ^ 0x10));
            auVar72._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar72._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar72._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar72._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar68 = vsubps_avx(auVar72,auVar124._0_16_);
            auVar73._0_4_ = auVar106._0_4_ * auVar68._0_4_;
            auVar73._4_4_ = auVar106._4_4_ * auVar68._4_4_;
            auVar73._8_4_ = auVar106._8_4_ * auVar68._8_4_;
            auVar73._12_4_ = auVar106._12_4_ * auVar68._12_4_;
            pfVar2 = (float *)(uVar17 + 0x80 + (uVar21 ^ 0x10));
            pfVar1 = (float *)(uVar17 + 0x20 + (uVar21 ^ 0x10));
            auVar89._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar89._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar89._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar89._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar68 = vsubps_avx(auVar89,auVar131._0_16_);
            auVar90._0_4_ = auVar155._0_4_ * auVar68._0_4_;
            auVar90._4_4_ = auVar155._4_4_ * auVar68._4_4_;
            auVar90._8_4_ = auVar155._8_4_ * auVar68._8_4_;
            auVar90._12_4_ = auVar155._12_4_ * auVar68._12_4_;
            auVar68 = vminps_avx(auVar73,auVar90);
            auVar82 = vminps_avx(auVar82,auVar68);
            auVar40 = vcmpps_avx(auVar40,auVar82,2);
            if (((uint)uVar28 & 7) == 6) {
              auVar82 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0xe0),auVar29,2);
              auVar68 = vcmpps_avx(auVar29,*(undefined1 (*) [16])(uVar17 + 0xf0),1);
              auVar82 = vandps_avx(auVar82,auVar68);
              auVar40 = vandps_avx(auVar82,auVar40);
            }
            auVar40 = vpslld_avx(auVar40,0x1f);
            uVar18 = vmovmskps_avx(auVar40);
            if (uVar18 == 0) goto LAB_00b6f049;
            uVar18 = uVar18 & 0xff;
            lVar22 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            uVar28 = *(ulong *)(uVar17 + lVar22 * 8);
            uVar18 = uVar18 - 1 & uVar18;
            uVar19 = (ulong)uVar18;
          } while (uVar18 == 0);
          do {
            *puVar23 = uVar28;
            puVar23 = puVar23 + 1;
            lVar22 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            uVar28 = *(ulong *)(uVar17 + lVar22 * 8);
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00b6f1dc:
  if (local_9d0 == lVar22) goto LAB_00b6f049;
  lVar20 = local_9d0 * 0x140;
  fVar3 = (ray->dir).field_0.m128[3];
  pfVar2 = (float *)(uVar28 + 0x90 + lVar20);
  pfVar1 = (float *)(uVar28 + lVar20);
  auVar41._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar41._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar41._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar41._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar28 + 0xa0 + lVar20);
  pfVar1 = (float *)(uVar28 + 0x10 + lVar20);
  auVar54._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar54._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar54._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar54._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar28 + 0xb0 + lVar20);
  pfVar1 = (float *)(uVar28 + 0x20 + lVar20);
  auVar135._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar135._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar135._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar135._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar28 + 0xc0 + lVar20);
  pfVar1 = (float *)(uVar28 + 0x30 + lVar20);
  auVar91._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar91._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar91._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar91._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar28 + 0xd0 + lVar20);
  pfVar1 = (float *)(uVar28 + 0x40 + lVar20);
  auVar102._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar102._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar102._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar102._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar28 + 0xe0 + lVar20);
  pfVar1 = (float *)(uVar28 + 0x50 + lVar20);
  auVar141._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar141._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar141._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar141._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar28 + 0xf0 + lVar20);
  pfVar1 = (float *)(uVar28 + 0x60 + lVar20);
  auVar119._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar119._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar119._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar119._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar28 + 0x100 + lVar20);
  pfVar1 = (float *)(uVar28 + 0x70 + lVar20);
  auVar128._0_4_ = fVar3 * *pfVar2 + *pfVar1;
  auVar128._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
  auVar128._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
  auVar128._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
  pfVar1 = (float *)(uVar28 + 0x110 + lVar20);
  pfVar2 = (float *)(uVar28 + 0x80 + lVar20);
  auVar30._0_4_ = fVar3 * *pfVar1 + *pfVar2;
  auVar30._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
  auVar30._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
  auVar30._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
  uVar4 = *(undefined4 *)&(ray->org).field_0;
  auVar132._4_4_ = uVar4;
  auVar132._0_4_ = uVar4;
  auVar132._8_4_ = uVar4;
  auVar132._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar147._4_4_ = uVar4;
  auVar147._0_4_ = uVar4;
  auVar147._8_4_ = uVar4;
  auVar147._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar153._4_4_ = uVar4;
  auVar153._0_4_ = uVar4;
  auVar153._8_4_ = uVar4;
  auVar153._12_4_ = uVar4;
  local_9e8 = vsubps_avx(auVar41,auVar132);
  local_a48 = vsubps_avx(auVar54,auVar147);
  local_a58 = vsubps_avx(auVar135,auVar153);
  auVar40 = vsubps_avx(auVar91,auVar132);
  auVar82 = vsubps_avx(auVar102,auVar147);
  auVar29 = vsubps_avx(auVar141,auVar153);
  auVar68 = vsubps_avx(auVar119,auVar132);
  auVar88 = vsubps_avx(auVar128,auVar147);
  auVar100 = vsubps_avx(auVar30,auVar153);
  local_9f8 = vsubps_avx(auVar68,local_9e8);
  local_a08 = vsubps_avx(auVar88,local_a48);
  local_a18 = vsubps_avx(auVar100,local_a58);
  fVar3 = local_a48._0_4_;
  fVar49 = auVar88._0_4_ + fVar3;
  fVar9 = local_a48._4_4_;
  fVar60 = auVar88._4_4_ + fVar9;
  fVar66 = local_a48._8_4_;
  fVar62 = auVar88._8_4_ + fVar66;
  fVar12 = local_a48._12_4_;
  fVar65 = auVar88._12_4_ + fVar12;
  fVar7 = local_a58._0_4_;
  fVar86 = auVar100._0_4_ + fVar7;
  fVar61 = local_a58._4_4_;
  fVar94 = auVar100._4_4_ + fVar61;
  fVar10 = local_a58._8_4_;
  fVar96 = auVar100._8_4_ + fVar10;
  fVar13 = local_a58._12_4_;
  fVar98 = auVar100._12_4_ + fVar13;
  fVar50 = local_a18._0_4_;
  auVar120._0_4_ = fVar50 * fVar49;
  fVar63 = local_a18._4_4_;
  auVar120._4_4_ = fVar63 * fVar60;
  fVar36 = local_a18._8_4_;
  auVar120._8_4_ = fVar36 * fVar62;
  fVar37 = local_a18._12_4_;
  auVar120._12_4_ = fVar37 * fVar65;
  fVar159 = local_a08._0_4_;
  auVar129._0_4_ = fVar159 * fVar86;
  fVar161 = local_a08._4_4_;
  auVar129._4_4_ = fVar161 * fVar94;
  fVar162 = local_a08._8_4_;
  auVar129._8_4_ = fVar162 * fVar96;
  fVar163 = local_a08._12_4_;
  auVar129._12_4_ = fVar163 * fVar98;
  auVar101 = vsubps_avx(auVar129,auVar120);
  fVar8 = local_9e8._0_4_;
  fVar117 = auVar68._0_4_ + fVar8;
  fVar64 = local_9e8._4_4_;
  fVar125 = auVar68._4_4_ + fVar64;
  fVar11 = local_9e8._8_4_;
  fVar126 = auVar68._8_4_ + fVar11;
  fVar14 = local_9e8._12_4_;
  fVar127 = auVar68._12_4_ + fVar14;
  fVar152 = local_9f8._0_4_;
  auVar92._0_4_ = fVar152 * fVar86;
  fVar156 = local_9f8._4_4_;
  auVar92._4_4_ = fVar156 * fVar94;
  fVar157 = local_9f8._8_4_;
  auVar92._8_4_ = fVar157 * fVar96;
  fVar158 = local_9f8._12_4_;
  auVar92._12_4_ = fVar158 * fVar98;
  auVar130._0_4_ = fVar117 * fVar50;
  auVar130._4_4_ = fVar125 * fVar63;
  auVar130._8_4_ = fVar126 * fVar36;
  auVar130._12_4_ = fVar127 * fVar37;
  auVar15 = vsubps_avx(auVar130,auVar92);
  auVar121._0_4_ = fVar159 * fVar117;
  auVar121._4_4_ = fVar161 * fVar125;
  auVar121._8_4_ = fVar162 * fVar126;
  auVar121._12_4_ = fVar163 * fVar127;
  auVar31._0_4_ = fVar152 * fVar49;
  auVar31._4_4_ = fVar156 * fVar60;
  auVar31._8_4_ = fVar157 * fVar62;
  auVar31._12_4_ = fVar158 * fVar65;
  auVar30 = vsubps_avx(auVar31,auVar121);
  local_a78._4_4_ = (ray->dir).field_0.m128[2];
  local_aa8._4_4_ = (ray->dir).field_0.m128[1];
  local_a88._4_4_ = (ray->dir).field_0.m128[0];
  local_a38._0_4_ =
       auVar101._0_4_ * local_a88._4_4_ +
       local_aa8._4_4_ * auVar15._0_4_ + local_a78._4_4_ * auVar30._0_4_;
  local_a38._4_4_ =
       auVar101._4_4_ * local_a88._4_4_ +
       local_aa8._4_4_ * auVar15._4_4_ + local_a78._4_4_ * auVar30._4_4_;
  local_a38._8_4_ =
       auVar101._8_4_ * local_a88._4_4_ +
       local_aa8._4_4_ * auVar15._8_4_ + local_a78._4_4_ * auVar30._8_4_;
  local_a38._12_4_ =
       auVar101._12_4_ * local_a88._4_4_ +
       local_aa8._4_4_ * auVar15._12_4_ + local_a78._4_4_ * auVar30._12_4_;
  local_a28 = vsubps_avx(local_a48,auVar82);
  auVar101 = vsubps_avx(local_a58,auVar29);
  fVar49 = fVar3 + auVar82._0_4_;
  fVar60 = fVar9 + auVar82._4_4_;
  fVar62 = fVar66 + auVar82._8_4_;
  fVar65 = fVar12 + auVar82._12_4_;
  fVar94 = auVar29._0_4_ + fVar7;
  fVar98 = auVar29._4_4_ + fVar61;
  fVar125 = auVar29._8_4_ + fVar10;
  fVar127 = auVar29._12_4_ + fVar13;
  fVar146 = auVar101._0_4_;
  auVar154._0_4_ = fVar146 * fVar49;
  fVar149 = auVar101._4_4_;
  auVar154._4_4_ = fVar149 * fVar60;
  fVar150 = auVar101._8_4_;
  auVar154._8_4_ = fVar150 * fVar62;
  fVar151 = auVar101._12_4_;
  auVar154._12_4_ = fVar151 * fVar65;
  fVar86 = local_a28._0_4_;
  auVar74._0_4_ = fVar86 * fVar94;
  fVar96 = local_a28._4_4_;
  auVar74._4_4_ = fVar96 * fVar98;
  fVar117 = local_a28._8_4_;
  auVar74._8_4_ = fVar117 * fVar125;
  fVar126 = local_a28._12_4_;
  auVar74._12_4_ = fVar126 * fVar127;
  auVar101 = vsubps_avx(auVar74,auVar154);
  auVar15 = vsubps_avx(local_9e8,auVar40);
  fVar134 = auVar15._0_4_;
  auVar93._0_4_ = fVar134 * fVar94;
  fVar137 = auVar15._4_4_;
  auVar93._4_4_ = fVar137 * fVar98;
  fVar138 = auVar15._8_4_;
  auVar93._8_4_ = fVar138 * fVar125;
  fVar139 = auVar15._12_4_;
  auVar93._12_4_ = fVar139 * fVar127;
  fVar94 = auVar40._0_4_ + fVar8;
  fVar98 = auVar40._4_4_ + fVar64;
  fVar125 = auVar40._8_4_ + fVar11;
  fVar127 = auVar40._12_4_ + fVar14;
  auVar122._0_4_ = fVar146 * fVar94;
  auVar122._4_4_ = fVar149 * fVar98;
  auVar122._8_4_ = fVar150 * fVar125;
  auVar122._12_4_ = fVar151 * fVar127;
  auVar15 = vsubps_avx(auVar122,auVar93);
  auVar111._0_4_ = fVar86 * fVar94;
  auVar111._4_4_ = fVar96 * fVar98;
  auVar111._8_4_ = fVar117 * fVar125;
  auVar111._12_4_ = fVar126 * fVar127;
  auVar32._0_4_ = fVar134 * fVar49;
  auVar32._4_4_ = fVar137 * fVar60;
  auVar32._8_4_ = fVar138 * fVar62;
  auVar32._12_4_ = fVar139 * fVar65;
  auVar30 = vsubps_avx(auVar32,auVar111);
  local_898._0_4_ =
       local_a88._4_4_ * auVar101._0_4_ +
       local_aa8._4_4_ * auVar15._0_4_ + local_a78._4_4_ * auVar30._0_4_;
  local_898._4_4_ =
       local_a88._4_4_ * auVar101._4_4_ +
       local_aa8._4_4_ * auVar15._4_4_ + local_a78._4_4_ * auVar30._4_4_;
  local_898._8_4_ =
       local_a88._4_4_ * auVar101._8_4_ +
       local_aa8._4_4_ * auVar15._8_4_ + local_a78._4_4_ * auVar30._8_4_;
  local_898._12_4_ =
       local_a88._4_4_ * auVar101._12_4_ +
       local_aa8._4_4_ * auVar15._12_4_ + local_a78._4_4_ * auVar30._12_4_;
  auVar101 = vsubps_avx(auVar40,auVar68);
  fVar67 = auVar40._0_4_ + auVar68._0_4_;
  fVar83 = auVar40._4_4_ + auVar68._4_4_;
  fVar84 = auVar40._8_4_ + auVar68._8_4_;
  fVar85 = auVar40._12_4_ + auVar68._12_4_;
  auVar40 = vsubps_avx(auVar82,auVar88);
  fVar94 = auVar82._0_4_ + auVar88._0_4_;
  fVar98 = auVar82._4_4_ + auVar88._4_4_;
  fVar125 = auVar82._8_4_ + auVar88._8_4_;
  fVar127 = auVar82._12_4_ + auVar88._12_4_;
  auVar82 = vsubps_avx(auVar29,auVar100);
  fVar49 = auVar29._0_4_ + auVar100._0_4_;
  fVar60 = auVar29._4_4_ + auVar100._4_4_;
  fVar62 = auVar29._8_4_ + auVar100._8_4_;
  fVar65 = auVar29._12_4_ + auVar100._12_4_;
  fVar87 = auVar82._0_4_;
  auVar103._0_4_ = fVar87 * fVar94;
  fVar95 = auVar82._4_4_;
  auVar103._4_4_ = fVar95 * fVar98;
  fVar97 = auVar82._8_4_;
  auVar103._8_4_ = fVar97 * fVar125;
  fVar99 = auVar82._12_4_;
  auVar103._12_4_ = fVar99 * fVar127;
  fVar140 = auVar40._0_4_;
  auVar112._0_4_ = fVar140 * fVar49;
  fVar143 = auVar40._4_4_;
  auVar112._4_4_ = fVar143 * fVar60;
  fVar144 = auVar40._8_4_;
  auVar112._8_4_ = fVar144 * fVar62;
  fVar145 = auVar40._12_4_;
  auVar112._12_4_ = fVar145 * fVar65;
  auVar40 = vsubps_avx(auVar112,auVar103);
  fVar118 = auVar101._0_4_;
  auVar42._0_4_ = fVar118 * fVar49;
  fVar49 = auVar101._4_4_;
  auVar42._4_4_ = fVar49 * fVar60;
  fVar60 = auVar101._8_4_;
  auVar42._8_4_ = fVar60 * fVar62;
  fVar62 = auVar101._12_4_;
  auVar42._12_4_ = fVar62 * fVar65;
  auVar113._0_4_ = fVar87 * fVar67;
  auVar113._4_4_ = fVar95 * fVar83;
  auVar113._8_4_ = fVar97 * fVar84;
  auVar113._12_4_ = fVar99 * fVar85;
  auVar82 = vsubps_avx(auVar113,auVar42);
  auVar75._0_4_ = fVar140 * fVar67;
  auVar75._4_4_ = fVar143 * fVar83;
  auVar75._8_4_ = fVar144 * fVar84;
  auVar75._12_4_ = fVar145 * fVar85;
  auVar55._0_4_ = fVar118 * fVar94;
  auVar55._4_4_ = fVar49 * fVar98;
  auVar55._8_4_ = fVar60 * fVar125;
  auVar55._12_4_ = fVar62 * fVar127;
  auVar29 = vsubps_avx(auVar55,auVar75);
  local_a78._0_4_ = local_a78._4_4_;
  fStack_a70 = local_a78._4_4_;
  fStack_a6c = local_a78._4_4_;
  local_aa8._0_4_ = local_aa8._4_4_;
  fStack_aa0 = local_aa8._4_4_;
  fStack_a9c = local_aa8._4_4_;
  local_a88._0_4_ = local_a88._4_4_;
  fStack_a80 = local_a88._4_4_;
  fStack_a7c = local_a88._4_4_;
  auVar43._0_4_ =
       local_a88._4_4_ * auVar40._0_4_ +
       local_aa8._4_4_ * auVar82._0_4_ + local_a78._4_4_ * auVar29._0_4_;
  auVar43._4_4_ =
       local_a88._4_4_ * auVar40._4_4_ +
       local_aa8._4_4_ * auVar82._4_4_ + local_a78._4_4_ * auVar29._4_4_;
  auVar43._8_4_ =
       local_a88._4_4_ * auVar40._8_4_ +
       local_aa8._4_4_ * auVar82._8_4_ + local_a78._4_4_ * auVar29._8_4_;
  auVar43._12_4_ =
       local_a88._4_4_ * auVar40._12_4_ +
       local_aa8._4_4_ * auVar82._12_4_ + local_a78._4_4_ * auVar29._12_4_;
  local_868._0_4_ = auVar43._0_4_ + local_a38._0_4_ + local_898._0_4_;
  local_868._4_4_ = auVar43._4_4_ + local_a38._4_4_ + local_898._4_4_;
  local_868._8_4_ = auVar43._8_4_ + local_a38._8_4_ + local_898._8_4_;
  local_868._12_4_ = auVar43._12_4_ + local_a38._12_4_ + local_898._12_4_;
  auVar40 = vminps_avx(local_a38,local_898);
  auVar40 = vminps_avx(auVar40,auVar43);
  auVar76._8_4_ = 0x7fffffff;
  auVar76._0_8_ = 0x7fffffff7fffffff;
  auVar76._12_4_ = 0x7fffffff;
  local_8a8 = vandps_avx(local_868,auVar76);
  auVar77._0_4_ = local_8a8._0_4_ * 1.1920929e-07;
  auVar77._4_4_ = local_8a8._4_4_ * 1.1920929e-07;
  auVar77._8_4_ = local_8a8._8_4_ * 1.1920929e-07;
  auVar77._12_4_ = local_8a8._12_4_ * 1.1920929e-07;
  uVar17 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
  auVar104._0_8_ = uVar17 ^ 0x8000000080000000;
  auVar104._8_4_ = -auVar77._8_4_;
  auVar104._12_4_ = -auVar77._12_4_;
  auVar40 = vcmpps_avx(auVar40,auVar104,5);
  auVar82 = vmaxps_avx(local_a38,local_898);
  auVar82 = vmaxps_avx(auVar82,auVar43);
  auVar82 = vcmpps_avx(auVar82,auVar77,2);
  auVar40 = vorps_avx(auVar40,auVar82);
  auVar15._8_8_ = uStack_960;
  auVar15._0_8_ = local_968;
  auVar15 = auVar15 & auVar40;
  if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar15[0xf] < '\0') {
    auVar44._0_4_ = fVar86 * fVar50;
    auVar44._4_4_ = fVar96 * fVar63;
    auVar44._8_4_ = fVar117 * fVar36;
    auVar44._12_4_ = fVar126 * fVar37;
    auVar56._0_4_ = fVar159 * fVar146;
    auVar56._4_4_ = fVar161 * fVar149;
    auVar56._8_4_ = fVar162 * fVar150;
    auVar56._12_4_ = fVar163 * fVar151;
    auVar68 = vsubps_avx(auVar56,auVar44);
    auVar78._0_4_ = fVar146 * fVar140;
    auVar78._4_4_ = fVar149 * fVar143;
    auVar78._8_4_ = fVar150 * fVar144;
    auVar78._12_4_ = fVar151 * fVar145;
    auVar105._0_4_ = fVar86 * fVar87;
    auVar105._4_4_ = fVar96 * fVar95;
    auVar105._8_4_ = fVar117 * fVar97;
    auVar105._12_4_ = fVar126 * fVar99;
    auVar88 = vsubps_avx(auVar105,auVar78);
    auVar82 = vandps_avx(auVar76,auVar44);
    auVar29 = vandps_avx(auVar76,auVar78);
    auVar82 = vcmpps_avx(auVar82,auVar29,1);
    local_808 = vblendvps_avx(auVar88,auVar68,auVar82);
    auVar45._0_4_ = fVar134 * fVar87;
    auVar45._4_4_ = fVar137 * fVar95;
    auVar45._8_4_ = fVar138 * fVar97;
    auVar45._12_4_ = fVar139 * fVar99;
    auVar57._0_4_ = fVar134 * fVar50;
    auVar57._4_4_ = fVar137 * fVar63;
    auVar57._8_4_ = fVar138 * fVar36;
    auVar57._12_4_ = fVar139 * fVar37;
    auVar79._0_4_ = fVar146 * fVar152;
    auVar79._4_4_ = fVar149 * fVar156;
    auVar79._8_4_ = fVar150 * fVar157;
    auVar79._12_4_ = fVar151 * fVar158;
    auVar68 = vsubps_avx(auVar57,auVar79);
    auVar107._0_4_ = fVar146 * fVar118;
    auVar107._4_4_ = fVar149 * fVar49;
    auVar107._8_4_ = fVar150 * fVar60;
    auVar107._12_4_ = fVar151 * fVar62;
    auVar88 = vsubps_avx(auVar107,auVar45);
    auVar82 = vandps_avx(auVar76,auVar79);
    auVar29 = vandps_avx(auVar76,auVar45);
    auVar82 = vcmpps_avx(auVar82,auVar29,1);
    local_7f8 = vblendvps_avx(auVar88,auVar68,auVar82);
    auVar33._0_4_ = fVar86 * fVar118;
    auVar33._4_4_ = fVar96 * fVar49;
    auVar33._8_4_ = fVar117 * fVar60;
    auVar33._12_4_ = fVar126 * fVar62;
    auVar58._0_4_ = fVar86 * fVar152;
    auVar58._4_4_ = fVar96 * fVar156;
    auVar58._8_4_ = fVar117 * fVar157;
    auVar58._12_4_ = fVar126 * fVar158;
    auVar80._0_4_ = fVar159 * fVar134;
    auVar80._4_4_ = fVar161 * fVar137;
    auVar80._8_4_ = fVar162 * fVar138;
    auVar80._12_4_ = fVar163 * fVar139;
    auVar108._0_4_ = fVar134 * fVar140;
    auVar108._4_4_ = fVar137 * fVar143;
    auVar108._8_4_ = fVar138 * fVar144;
    auVar108._12_4_ = fVar139 * fVar145;
    auVar68 = vsubps_avx(auVar58,auVar80);
    auVar88 = vsubps_avx(auVar108,auVar33);
    auVar82 = vandps_avx(auVar76,auVar80);
    auVar29 = vandps_avx(auVar76,auVar33);
    auVar82 = vcmpps_avx(auVar82,auVar29,1);
    local_7e8 = vblendvps_avx(auVar88,auVar68,auVar82);
    fVar50 = local_808._0_4_ * local_a88._4_4_ +
             local_7f8._0_4_ * local_aa8._4_4_ + local_7e8._0_4_ * local_a78._4_4_;
    fVar49 = local_808._4_4_ * local_a88._4_4_ +
             local_7f8._4_4_ * local_aa8._4_4_ + local_7e8._4_4_ * local_a78._4_4_;
    fVar63 = local_808._8_4_ * local_a88._4_4_ +
             local_7f8._8_4_ * local_aa8._4_4_ + local_7e8._8_4_ * local_a78._4_4_;
    fVar60 = local_808._12_4_ * local_a88._4_4_ +
             local_7f8._12_4_ * local_aa8._4_4_ + local_7e8._12_4_ * local_a78._4_4_;
    auVar81._0_4_ = fVar50 + fVar50;
    auVar81._4_4_ = fVar49 + fVar49;
    auVar81._8_4_ = fVar63 + fVar63;
    auVar81._12_4_ = fVar60 + fVar60;
    fVar50 = local_808._0_4_ * fVar8 + local_7f8._0_4_ * fVar3 + local_7e8._0_4_ * fVar7;
    fVar61 = local_808._4_4_ * fVar64 + local_7f8._4_4_ * fVar9 + local_7e8._4_4_ * fVar61;
    fVar64 = local_808._8_4_ * fVar11 + local_7f8._8_4_ * fVar66 + local_7e8._8_4_ * fVar10;
    fVar66 = local_808._12_4_ * fVar14 + local_7f8._12_4_ * fVar12 + local_7e8._12_4_ * fVar13;
    auVar82 = vrcpps_avx(auVar81);
    fVar3 = auVar82._0_4_;
    auVar114._0_4_ = auVar81._0_4_ * fVar3;
    fVar7 = auVar82._4_4_;
    auVar114._4_4_ = auVar81._4_4_ * fVar7;
    fVar8 = auVar82._8_4_;
    auVar114._8_4_ = auVar81._8_4_ * fVar8;
    fVar9 = auVar82._12_4_;
    auVar114._12_4_ = auVar81._12_4_ * fVar9;
    auVar123._8_4_ = 0x3f800000;
    auVar123._0_8_ = 0x3f8000003f800000;
    auVar123._12_4_ = 0x3f800000;
    auVar82 = vsubps_avx(auVar123,auVar114);
    local_818._0_4_ = (fVar50 + fVar50) * (fVar3 + fVar3 * auVar82._0_4_);
    local_818._4_4_ = (fVar61 + fVar61) * (fVar7 + fVar7 * auVar82._4_4_);
    local_818._8_4_ = (fVar64 + fVar64) * (fVar8 + fVar8 * auVar82._8_4_);
    local_818._12_4_ = (fVar66 + fVar66) * (fVar9 + fVar9 * auVar82._12_4_);
    uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar109._4_4_ = uVar4;
    auVar109._0_4_ = uVar4;
    auVar109._8_4_ = uVar4;
    auVar109._12_4_ = uVar4;
    auVar82 = vcmpps_avx(auVar109,local_818,2);
    fVar3 = ray->tfar;
    auVar115._4_4_ = fVar3;
    auVar115._0_4_ = fVar3;
    auVar115._8_4_ = fVar3;
    auVar115._12_4_ = fVar3;
    auVar29 = vcmpps_avx(local_818,auVar115,2);
    auVar82 = vandps_avx(auVar82,auVar29);
    auVar29 = vcmpps_avx(auVar81,_DAT_01f45a50,4);
    auVar82 = vandps_avx(auVar29,auVar82);
    auVar16._8_8_ = uStack_960;
    auVar16._0_8_ = local_968;
    auVar40 = vandps_avx(auVar40,auVar16);
    auVar82 = vpslld_avx(auVar82,0x1f);
    auVar82 = vpsrad_avx(auVar82,0x1f);
    local_848 = vpand_avx(auVar82,auVar40);
    uVar18 = vmovmskps_avx(local_848);
    if (uVar18 != 0) {
      local_aa8 = lVar20 + uVar28;
      local_888 = local_a38;
      local_878 = local_898;
      local_858 = &local_aa9;
      auVar40 = vrcpps_avx(local_868);
      fVar3 = auVar40._0_4_;
      auVar46._0_4_ = local_868._0_4_ * fVar3;
      fVar7 = auVar40._4_4_;
      auVar46._4_4_ = local_868._4_4_ * fVar7;
      fVar8 = auVar40._8_4_;
      auVar46._8_4_ = local_868._8_4_ * fVar8;
      fVar9 = auVar40._12_4_;
      auVar46._12_4_ = local_868._12_4_ * fVar9;
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      auVar40 = vsubps_avx(auVar59,auVar46);
      auVar34._0_4_ = fVar3 + fVar3 * auVar40._0_4_;
      auVar34._4_4_ = fVar7 + fVar7 * auVar40._4_4_;
      auVar34._8_4_ = fVar8 + fVar8 * auVar40._8_4_;
      auVar34._12_4_ = fVar9 + fVar9 * auVar40._12_4_;
      auVar47._8_4_ = 0x219392ef;
      auVar47._0_8_ = 0x219392ef219392ef;
      auVar47._12_4_ = 0x219392ef;
      auVar40 = vcmpps_avx(local_8a8,auVar47,5);
      auVar40 = vandps_avx(auVar40,auVar34);
      auVar48._0_4_ = local_a38._0_4_ * auVar40._0_4_;
      auVar48._4_4_ = local_a38._4_4_ * auVar40._4_4_;
      auVar48._8_4_ = local_a38._8_4_ * auVar40._8_4_;
      auVar48._12_4_ = local_a38._12_4_ * auVar40._12_4_;
      local_838 = vminps_avx(auVar48,auVar59);
      auVar35._0_4_ = local_898._0_4_ * auVar40._0_4_;
      auVar35._4_4_ = local_898._4_4_ * auVar40._4_4_;
      auVar35._8_4_ = local_898._8_4_ * auVar40._8_4_;
      auVar35._12_4_ = local_898._12_4_ * auVar40._12_4_;
      local_828 = vminps_avx(auVar35,auVar59);
      uVar17 = (ulong)(uVar18 & 0xff);
      local_a78 = local_a60->scene;
      lVar20 = lVar20 + uVar28;
      pSVar25 = local_a60->scene;
      do {
        uVar19 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_9b0 = *(uint *)(lVar20 + 0x120 + uVar19 * 4);
        pGVar6 = (pSVar25->geometries).items[local_9b0].ptr;
        if ((pGVar6->mask & ray->mask) == 0) {
          uVar17 = uVar17 ^ 1L << (uVar19 & 0x3f);
        }
        else {
          local_a88 = uVar19;
          local_9e8._0_8_ = uVar17;
          if ((local_a60->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b6f9bf;
          local_a48._0_8_ = local_a60->args;
          local_a18._0_8_ = lVar22;
          local_a08._0_8_ = uVar24;
          local_9f8._0_8_ = puVar23;
          local_998.context = local_a60->user;
          local_9c8 = *(undefined4 *)(local_808 + uVar19 * 4);
          local_9c4 = *(undefined4 *)(local_7f8 + uVar19 * 4);
          local_9c0 = *(undefined4 *)(local_7e8 + uVar19 * 4);
          local_9bc = *(undefined4 *)(local_838 + uVar19 * 4);
          local_9b8 = *(undefined4 *)(local_828 + uVar19 * 4);
          local_9b4 = *(undefined4 *)(local_aa8 + 0x130 + uVar19 * 4);
          local_9ac = (local_998.context)->instID[0];
          local_9a8 = (local_998.context)->instPrimID[0];
          local_a28._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_818 + uVar19 * 4);
          local_a8c = -1;
          local_998.valid = &local_a8c;
          local_998.geometryUserPtr = pGVar6->userPtr;
          local_a58._0_8_ = ray;
          local_998.hit = (RTCHitN *)&local_9c8;
          local_998.N = 1;
          local_a38._0_8_ = pGVar6;
          local_998.ray = (RTCRayN *)ray;
          if ((pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar6->occlusionFilterN)(&local_998), *local_998.valid != 0)) {
            ray = (Ray *)local_a58._0_8_;
            if ((*(code **)(local_a48._0_8_ + 0x10) == (code *)0x0) ||
               (((*(byte *)local_a48._0_8_ & 2) == 0 &&
                ((*(byte *)(local_a38._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00b6f9bf:
              ray->tfar = -INFINITY;
              return;
            }
            (**(code **)(local_a48._0_8_ + 0x10))(&local_998);
            ray = (Ray *)local_a58._0_8_;
            if (*local_998.valid != 0) goto LAB_00b6f9bf;
          }
          *(undefined4 *)(local_a58._0_8_ + 0x20) = local_a28._0_4_;
          uVar17 = local_9e8._0_8_ ^ 1L << (local_a88 & 0x3f);
          ray = (Ray *)local_a58._0_8_;
          lVar22 = local_a18._0_8_;
          puVar23 = (ulong *)local_9f8._0_8_;
          uVar24 = local_a08._0_8_;
        }
        lVar20 = local_aa8;
        pSVar25 = local_a78;
      } while (uVar17 != 0);
    }
  }
  local_9d0 = local_9d0 + 1;
  auVar116 = ZEXT1664(local_8b8);
  auVar124 = ZEXT1664(local_8c8);
  auVar131 = ZEXT1664(local_8d8);
  auVar133 = ZEXT1664(local_8e8);
  auVar136 = ZEXT1664(local_8f8);
  auVar142 = ZEXT1664(local_908);
  auVar148 = ZEXT1664(local_918);
  auVar106 = ZEXT1664(local_928);
  auVar155 = ZEXT1664(local_938);
  auVar110 = ZEXT1664(local_948);
  auVar160 = ZEXT1664(local_958);
  goto LAB_00b6f1dc;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }